

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O3

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
::readFromFile(IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *this,char *filename,Index rows,Index cols,bool withTimeStamp)

{
  uint uVar1;
  _Map_pointer ppMVar2;
  long lVar3;
  char cVar4;
  reference dst;
  long lVar5;
  long lVar6;
  undefined7 in_register_00000081;
  long lVar7;
  long lVar8;
  Matrix m;
  int k;
  ifstream f;
  assign_op<double,_double> local_28d;
  undefined4 local_28c;
  Matrix<double,__1,__1,_0,__1,__1> local_288;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_268;
  _Deque_iterator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_*>
  *local_250;
  Deque *local_248;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *local_240;
  long local_238 [4];
  uint auStack_218 [122];
  
  local_28c = (undefined4)CONCAT71(in_register_00000081,withTimeStamp);
  this->k_ = 0;
  local_248 = &this->v_;
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::clear(local_248);
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)filename);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    local_268.m_functor.m_other = 0.0;
    local_268.m_rows.m_value = rows;
    local_268.m_cols.m_value = cols;
    if ((cols | rows) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              (&local_288,&local_268,&local_28d);
    local_268.m_rows.m_value = local_268.m_rows.m_value & 0xffffffff00000000;
    local_250 = &(this->v_).
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start;
    local_240 = this;
    do {
      if ((char)local_28c != '\0') {
        std::istream::operator>>((istream *)local_238,(int *)&local_268);
      }
      uVar1 = *(uint *)((long)auStack_218 + *(long *)(local_238[0] + -0x18));
      if ((uVar1 & 5) != 0) break;
      if (0 < rows) {
        lVar8 = 0;
        do {
          if (0 < cols) {
            lVar7 = 0;
            do {
              if ((local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows <= lVar8) ||
                 (local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols <= lVar7)) {
                __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                             );
              }
              std::istream::_M_extract<double>((double *)local_238);
              lVar7 = lVar7 + 1;
            } while (cols != lVar7);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 != rows);
      }
      ppMVar2 = (local_240->v_).
                super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      lVar8 = (long)(int)local_268.m_rows.m_value;
      lVar5 = ((long)(local_240->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur -
               (long)(local_240->v_).
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555
              + (((long)ppMVar2 -
                  (long)(local_240->v_).
                        super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                (ulong)(ppMVar2 == (_Map_pointer)0x0)) * 0x15;
      lVar7 = (long)(local_240->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(local_240->v_).
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3;
      lVar6 = lVar7 * -0x5555555555555555 + lVar5;
      if (lVar6 == 0) {
LAB_001057ab:
        if (lVar5 == lVar7 * 0x5555555555555555) {
          local_240->k_ = lVar8;
        }
        std::
        deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back(local_248,&local_288);
      }
      else {
        lVar3 = local_240->k_;
        lVar6 = lVar6 + lVar3;
        if ((lVar8 < lVar3) || (lVar6 <= lVar8)) {
          if (lVar6 != lVar8) {
            __assert_fail("(v_.size()==0 || k_+ TimeIndex(v_.size()) == time )&& \"Error: New time instants must be consecutive to existing ones\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                          ,0x1a2,
                          "void stateObservation::IndexedMatrixArrayT<>::checkNext_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, -1>, Allocator = std::allocator<Eigen::Matrix<double, -1, -1>>]"
                         );
          }
          goto LAB_001057ab;
        }
        dst = std::
              _Deque_iterator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_&,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_*>
              ::operator[](local_250,lVar8 - lVar3);
        Eigen::internal::
        call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                  (dst,&local_288,&local_28d);
      }
      local_268.m_rows.m_value._0_4_ = (int)local_268.m_rows.m_value + 1;
    } while ((uVar1 & 5) == 0);
    free(local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::readFromFile(const char * filename, Index rows, Index cols, bool withTimeStamp)
{
  reset();

  std::ifstream f;

  f.open(filename);

  if (f.is_open())
  {

    Matrix m(Matrix::Zero(rows,cols));

    bool continuation=true;
    int k=0;

    while (continuation)
    {


      if (withTimeStamp)
      {
        f >> k;
      }


      if (f.fail())
        continuation=false;
      else
      {
        for (Index i = 0 ; i<rows; ++i)
        {
          for (Index j = 0 ; j<cols; ++j)
          {
            f >> m(i,j);
          }
        }

        setValue(m,k);
        ++k;
      }
    }
  }
}